

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

ArrayPtr<void_*const>
kj::computeRelativeTrace(ArrayPtr<void_*const> trace,ArrayPtr<void_*const> relativeTo)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  ArrayPtr<void_*const> AVar18;
  
  uVar9 = trace.size_;
  uVar3 = relativeTo.size_;
  uVar7 = uVar9;
  if (3 < uVar3 && 3 < uVar9) {
    if ((long)(4 - uVar9) <= (long)(uVar3 - 4)) {
      lVar12 = uVar9 - 4;
      uVar8 = 3;
      lVar10 = 4 - uVar9;
      do {
        lVar11 = 0;
        if (0 < lVar10) {
          lVar11 = lVar10;
        }
        lVar15 = 0;
        if (0 < lVar12) {
          lVar15 = lVar12;
        }
        uVar4 = (uVar9 - 1) - lVar15;
        uVar14 = (uVar3 - 1) - lVar11;
        if (uVar4 < uVar14) {
          uVar14 = uVar4;
        }
        lVar13 = -lVar10;
        if (-lVar10 == 0 || 0 < lVar10) {
          lVar13 = 0;
        }
        lVar13 = uVar9 - lVar13;
        uVar2 = 0;
        if (uVar3 - lVar11 != 0 && lVar13 != 0) {
          uVar4 = (uVar3 - lVar11) - 1;
          if (lVar13 - 1U <= uVar4) {
            uVar4 = lVar13 - 1U;
          }
          lVar16 = -8;
          lVar5 = 0;
          do {
            lVar6 = lVar5;
            if (*(long *)((long)trace.ptr + lVar16 + lVar15 * -8 + uVar9 * 8) !=
                *(long *)((long)relativeTo.ptr + lVar16 + lVar11 * -8 + uVar3 * 8)) break;
            lVar5 = lVar5 + 1;
            lVar16 = lVar16 + -8;
            lVar6 = uVar4 + 1;
          } while (uVar14 + 1 != lVar5);
          uVar2 = (uint)lVar6;
        }
        bVar17 = uVar8 < uVar2;
        uVar1 = uVar2;
        if (!bVar17 && uVar8 != uVar2) {
          uVar1 = uVar8;
        }
        uVar8 = uVar1;
        if (bVar17) {
          uVar7 = (lVar13 - (ulong)uVar2) + 1;
        }
        lVar12 = lVar12 + -1;
        bVar17 = lVar10 != uVar3 - 4;
        lVar10 = lVar10 + 1;
      } while (bVar17);
    }
  }
  AVar18.size_ = uVar7;
  AVar18.ptr = trace.ptr;
  return AVar18;
}

Assistant:

kj::ArrayPtr<void* const> computeRelativeTrace(
    kj::ArrayPtr<void* const> trace, kj::ArrayPtr<void* const> relativeTo) {
  using miniposix::ssize_t;

  static constexpr size_t MIN_MATCH_LEN = 4;
  if (trace.size() < MIN_MATCH_LEN || relativeTo.size() < MIN_MATCH_LEN) {
    return trace;
  }

  kj::ArrayPtr<void* const> bestMatch = trace;
  uint bestMatchLen = MIN_MATCH_LEN - 1;  // must beat this to choose something else

  // `trace` and `relativeTrace` may have been truncated at different points. We iterate through
  // truncating various suffixes from one of the two and then seeing if the remaining suffixes
  // match.
  for (ssize_t i = -(ssize_t)(trace.size() - MIN_MATCH_LEN);
       i <= (ssize_t)(relativeTo.size() - MIN_MATCH_LEN);
       i++) {
    // Negative values truncate `trace`, positive values truncate `relativeTo`.
    kj::ArrayPtr<void* const> subtrace = trace.first(trace.size() - kj::max<ssize_t>(0, -i));
    kj::ArrayPtr<void* const> subrt = relativeTo
        .first(relativeTo.size() - kj::max<ssize_t>(0, i));

    uint matchLen = sharedSuffixLength(subtrace, subrt);
    if (matchLen > bestMatchLen) {
      bestMatchLen = matchLen;
      bestMatch = subtrace.first(subtrace.size() - matchLen + 1);
    }
  }

  return bestMatch;
}